

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib666.c
# Opt level: O1

int test(char *URL)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  
  uVar6 = 0;
  do {
    cVar1 = '\n';
    if ((uVar6 / 0x4d) * 0x4d + 0x4c != uVar6) {
      cVar1 = ((char)(uVar6 / 0x1a) * -0x1a + 0x40U | 1) + (char)uVar6;
    }
    buffer[uVar6] = cVar1;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 17000);
  iVar2 = curl_global_init(3);
  if (iVar2 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    pcVar7 = "curl_easy_init() failed\n";
LAB_0010136a:
    lVar4 = 0;
  }
  else {
    lVar4 = curl_mime_init(lVar3);
    if (lVar4 == 0) {
      pcVar7 = "curl_mime_init() failed\n";
      goto LAB_0010136a;
    }
    lVar5 = curl_mime_addpart(lVar4);
    if (lVar5 != 0) {
      iVar2 = curl_mime_name(lVar5,"upfile");
      if (iVar2 == 0) {
        iVar2 = curl_mime_filename(lVar5,"myfile.txt");
        if (iVar2 == 0) {
          iVar2 = curl_mime_data(lVar5,buffer,17000);
          if (iVar2 == 0) {
            iVar2 = curl_mime_encoder(lVar5,"binary");
            if (iVar2 == 0) {
              iVar2 = curl_easy_setopt(lVar3,0x2712,URL);
              if ((((iVar2 == 0) && (iVar2 = curl_easy_setopt(lVar3,0x281d,lVar4), iVar2 == 0)) &&
                  (iVar2 = curl_easy_setopt(lVar3,0x118,0x401b), iVar2 == 0)) &&
                 ((iVar2 = curl_easy_setopt(lVar3,0x29,1), iVar2 == 0 &&
                  (iVar2 = curl_easy_setopt(lVar3,0x2a,1), iVar2 == 0)))) {
                iVar2 = curl_easy_perform(lVar3);
              }
              goto LAB_00101413;
            }
            pcVar7 = "curl_mime_encoder() failed\n";
          }
          else {
            pcVar7 = "curl_mime_data() failed\n";
          }
        }
        else {
          pcVar7 = "curl_mime_filename() failed\n";
        }
      }
      else {
        pcVar7 = "curl_mime_name() failed\n";
      }
      curl_mfprintf(_stderr,pcVar7);
      goto LAB_00101413;
    }
    pcVar7 = "curl_mime_addpart() failed\n";
  }
  curl_mfprintf(_stderr,pcVar7);
  iVar2 = 0x7e;
LAB_00101413:
  curl_easy_cleanup(lVar3);
  curl_mime_free(lVar4);
  curl_global_cleanup();
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  size_t i;

  /* Checks huge binary-encoded mime post. */

  /* Create a buffer with pseudo-binary data. */
  for(i = 0; i < sizeof(buffer); i++)
    if(i % 77 == 76)
      buffer[i] = '\n';
    else
      buffer[i] = (char) (0x41 + i % 26); /* A...Z */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_name(part, "upfile");
  if(res) {
    fprintf(stderr, "curl_mime_name() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.txt");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "binary");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Post form */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* Shorten upload buffer. */
  test_setopt(curl, CURLOPT_UPLOAD_BUFFERSIZE, 16411L);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  curl_global_cleanup();

  return res;
}